

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasmbox.c
# Opt level: O2

int parse_export_section(wasmbox_input_stream_t *ins,wasm_u64_t section_size,wasmbox_module_t *mod)

{
  byte bVar1;
  wasmbox_name_t *in_RAX;
  wasm_u64_t wVar2;
  wasm_u64_t wVar3;
  wasm_u64_t i;
  ulong uVar4;
  wasmbox_name_t *local_38;
  
  local_38 = in_RAX;
  wVar2 = wasmbox_parse_unsigned_leb128(ins->data + ins->index,&ins->index,ins->length);
  uVar4 = 0;
  do {
    if (wVar2 == uVar4) {
LAB_00103199:
      return -(uint)(uVar4 < wVar2);
    }
    parse_name(ins,&local_38);
    bVar1 = wasmbox_input_stream_read_u8(ins);
    if (3 < bVar1) {
      fprintf(_stderr,"(%s:%d)unreachable",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/imasahiro[P]wasmbox/src/wasmbox.c"
              ,0x57e);
      goto LAB_00103199;
    }
    wVar3 = wasmbox_parse_unsigned_leb128(ins->data + ins->index,&ins->index,ins->length);
    if (bVar1 == 0) {
      mod->functions[wVar3 & 0xffffffff]->name = local_38;
    }
    else {
      wasmbox_free(local_38);
    }
    uVar4 = uVar4 + 1;
  } while( true );
}

Assistant:

static int parse_export_section(wasmbox_input_stream_t *ins,
                                wasm_u64_t section_size,
                                wasmbox_module_t *mod) {
  wasm_u64_t len = wasmbox_parse_unsigned_leb128(ins->data + ins->index,
                                                 &ins->index, ins->length);
  for (wasm_u64_t i = 0; i < len; i++) {
    if (parse_export_entry(ins, mod) != 0) {
      return -1;
    }
  }
  return 0;
}